

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppMemory.h
# Opt level: O0

void __thiscall cppforth::Forth::memFree(Forth *this)

{
  Cell CVar1;
  uint uVar2;
  reference pvVar3;
  size_type sVar4;
  reference __b;
  ulong local_20;
  size_type i;
  uint addr;
  Forth *this_local;
  
  requireDStackDepth(this,1,"FREE");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  local_20 = std::
             vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
             ::size(&this->VirtualMemory);
  do {
    local_20 = local_20 - 1;
    if (local_20 < 3) {
      ForthStack<unsigned_int>::setTop(&this->dStack,0xffffffc4);
      return;
    }
    pvVar3 = std::
             vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
             ::operator[](&this->VirtualMemory,local_20);
  } while (pvVar3->start != uVar2);
  CVar1 = this->VirtualMemoryFreeSegment;
  pvVar3 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::operator[](&this->VirtualMemory,local_20);
  if (CVar1 == pvVar3->end) {
    pvVar3 = std::
             vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
             ::operator[](&this->VirtualMemory,local_20);
    this->VirtualMemoryFreeSegment = pvVar3->start;
  }
  sVar4 = std::
          vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
          ::size(&this->VirtualMemory);
  if (local_20 < sVar4 - 1) {
    pvVar3 = std::
             vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
             ::operator[](&this->VirtualMemory,local_20);
    sVar4 = std::
            vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
            ::size(&this->VirtualMemory);
    __b = std::
          vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
          ::operator[](&this->VirtualMemory,sVar4 - 1);
    std::swap<cppforth::Forth::VirtualMemorySegment>(pvVar3,__b);
  }
  sVar4 = std::
          vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
          ::size(&this->VirtualMemory);
  std::
  vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
  ::resize(&this->VirtualMemory,sVar4 - 1);
  ForthStack<unsigned_int>::setTop(&this->dStack,0);
  return;
}

Assistant:

void memFree() {
			REQUIRE_DSTACK_DEPTH(1, "FREE");
			auto addr = dStack.getTop();
			for (auto i = VirtualMemory.size() - 1; i > vmSegmentDataSpace; --i){
				if (VirtualMemory[i].start == addr){
					if (VirtualMemoryFreeSegment == VirtualMemory[i].end){
						VirtualMemoryFreeSegment = VirtualMemory[i].start;
					}
					if (i < VirtualMemory.size() - 1){
						std::swap(VirtualMemory[i], VirtualMemory[VirtualMemory.size() - 1]);
					}
					VirtualMemory.resize(VirtualMemory.size() - 1);

					dStack.setTop(0);
					return;
				}
			}
			dStack.setTop(CELL(errorFree));
		}